

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O3

int bitfield_check(nvamemtiming_conf *conf)

{
  byte bVar1;
  FILE *__stream;
  int b;
  int iVar2;
  char outfile [21];
  char acStack_48 [32];
  
  iVar2 = 0;
  snprintf(acStack_48,0x14,"entry_b_%i");
  __stream = fopen(acStack_48,"wb");
  if (__stream == (FILE *)0x0) {
    perror("Open the output file");
    iVar2 = 1;
  }
  else {
    printf("Bitfield mode: test index %i\n",(ulong)(conf->field_4).manual.index);
    launch(conf,(FILE *)__stream,'\0',NO_COLOR);
    bVar1 = (conf->field_4).manual.index;
    do {
      (conf->vbios).data[(ulong)bVar1 + (ulong)(conf->vbios).timing_entry_offset] =
           (uint8_t)(1 << ((byte)iVar2 & 0x1f));
      launch(conf,(FILE *)__stream,bVar1 + 1,COLOR);
      iVar2 = iVar2 + 1;
    } while (iVar2 != 8);
    fclose(__stream);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int bitfield_check(struct nvamemtiming_conf *conf)
{
	char outfile[21];

	snprintf(outfile, 20, "entry_b_%i", conf->bitfield.index);

	/* TODO: get this filename from the command line */
	FILE *outf = fopen(outfile, "wb");
	if (!outf) {
		perror("Open the output file");
		return 1;
	}

	printf("Bitfield mode: test index %i\n", conf->bitfield.index);

	launch(conf, outf, 0, NO_COLOR);
	iterate_bitfield(conf, outf, conf->bitfield.index, COLOR);

	fclose(outf);

	return 0;
}